

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O1

void lts2::WaveletTransform(Mat *X,int Jmin,string *wavelet,uint options)

{
  double dVar1;
  vector<int,_std::allocator<int>_> Jlist;
  int local_3c;
  void *local_38;
  iterator iStack_30;
  int *local_28;
  
  dVar1 = log2((double)*(int *)(X + 8));
  dVar1 = floor(dVar1);
  local_38 = (void *)0x0;
  iStack_30._M_current = (int *)0x0;
  local_28 = (int *)0x0;
  local_3c = (int)dVar1 + -1;
  if (Jmin < local_3c) {
    do {
      if (iStack_30._M_current == local_28) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_38,iStack_30,&local_3c);
      }
      else {
        *iStack_30._M_current = local_3c;
        iStack_30._M_current = iStack_30._M_current + 1;
      }
      local_3c = local_3c + -1;
    } while (Jmin < local_3c);
  }
  if (local_38 != (void *)0x0) {
    operator_delete(local_38,(long)local_28 - (long)local_38);
  }
  return;
}

Assistant:

void lts2::WaveletTransform(cv::Mat const &X, int Jmin, std::string const &wavelet, unsigned int options)
{
  float const h[] = {1.586134342, -.05298011854, -.8829110762, .4435068522, 1.149604398};
  bool isReverse = false;
  bool isTranslationInvariant = false;
    
  //---------------- Handle separable wavelet transform here ----------------
    
  //---------------- Non-separable case ----------------
    
  int n = X.rows;
  int m = (sizeof(h)/sizeof(float) - 1)/2;
  int Jmax = (int)floor(log2(n)) - 1;

  std::vector<int> Jlist;
  int j = Jmax;
  while (j > Jmin) 
  {
    Jlist.push_back(j);
    --j;
  }
  if (isReverse)
  {
    std::reverse(Jlist.begin(), Jlist.end());
  }
    
  if (isTranslationInvariant == false)
  {
    std::vector<int>::const_iterator it_j = Jlist.begin();
    for ( ; it_j != Jlist.end(); ++it_j)
    {
      // Horizontal lifting step
      // Vertical lifting step
    }
  }
  else
  {
        
  }
}